

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  uint uVar1;
  int nTerm;
  Fts3Table *p_00;
  Fts3MultiSegReader *pCsr_00;
  char *zTerm;
  Fts3SegReader **ppFVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  code *xCmp;
  long lVar11;
  int iVar12;
  Fts3PhraseToken *pTok;
  long in_FS_OFFSET;
  bool bVar13;
  Fts3Table *pTab;
  int nThis;
  char *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  if (((bOptOk == 0) || (pCsr->bDesc != p_00->bDescIdx)) || (p->nToken - 5U < 0xfffffffc)) {
LAB_001ce31d:
    if (0 < p->nToken) {
      pTok = p->aToken;
      lVar7 = 0;
      iVar12 = 0;
      do {
        iVar5 = 0;
        if (pTok->pSegcsr != (Fts3MultiSegReader *)0x0) {
          local_3c = 0;
          local_48 = (char *)0x0;
          iVar5 = fts3TermSelect(p_00,pTok,p->iColumn,&local_3c,&local_48);
          if (iVar5 == 0) {
            iVar5 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar7,local_48,local_3c);
          }
        }
        if (iVar5 != 0) break;
        lVar7 = lVar7 + 1;
        pTok = pTok + 1;
      } while (lVar7 < p->nToken);
      goto LAB_001ce3a1;
    }
    iVar5 = 0;
  }
  else {
    uVar1 = p->nToken;
    bVar4 = 0;
    uVar3 = uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    if ((int)uVar1 < 1) goto LAB_001ce31d;
    lVar7 = 0;
    do {
      if (*(int *)((long)&p->aToken[0].bFirst + lVar7) == 0) {
        lVar11 = *(long *)((long)&p->aToken[0].pSegcsr + lVar7);
        bVar8 = 1;
        if ((lVar11 != 0) && (*(int *)(lVar11 + 0x34) == 0)) goto LAB_001ce173;
        bVar13 = false;
      }
      else {
LAB_001ce173:
        bVar13 = true;
        bVar8 = 0;
      }
      if (*(long *)((long)&p->aToken[0].pSegcsr + lVar7) != 0) {
        bVar4 = 1;
      }
    } while ((!bVar13) &&
            (bVar13 = (ulong)uVar3 * 0x28 + -0x28 != lVar7, lVar7 = lVar7 + 0x28, bVar13));
    if (!(bool)(bVar8 & bVar4)) goto LAB_001ce31d;
    iVar6 = -1;
    if (p->iColumn < p_00->nColumn) {
      iVar6 = p->iColumn;
    }
    iVar12 = 1;
    iVar5 = 1;
    if (0 < p->nToken) {
      lVar7 = 0;
      do {
        pCsr_00 = p->aToken[lVar7].pSegcsr;
        iVar5 = 0;
        if (pCsr_00 != (Fts3MultiSegReader *)0x0) {
          zTerm = p->aToken[lVar7].z;
          nTerm = p->aToken[lVar7].n;
          uVar1 = pCsr_00->nSegment;
          xCmp = fts3SegReaderDoclistCmpRev;
          if (p_00->bDescIdx == '\0') {
            xCmp = fts3SegReaderDoclistCmp;
          }
          iVar5 = fts3SegReaderStart(p_00,pCsr_00,zTerm,nTerm);
          if (iVar5 == 0) {
            lVar11 = 0;
            uVar10 = 0;
            if (0 < (int)uVar1) {
              ppFVar2 = pCsr_00->apSegment;
              uVar9 = 0;
              do {
                uVar10 = uVar9;
                if ((ppFVar2[uVar9]->aNode == (char *)0x0) ||
                   (iVar5 = fts3SegReaderTermCmp(ppFVar2[uVar9],zTerm,nTerm), iVar5 != 0)) break;
                uVar9 = uVar9 + 1;
                uVar10 = (ulong)uVar1;
              } while (uVar1 != uVar9);
            }
            pCsr_00->nAdvance = (int)uVar10;
            if (0 < (int)uVar10) {
              lVar11 = 0;
              do {
                iVar5 = fts3SegReaderFirstDocid(p_00,pCsr_00->apSegment[lVar11]);
                if (iVar5 != 0) goto LAB_001ce300;
                lVar11 = lVar11 + 1;
              } while (lVar11 < pCsr_00->nAdvance);
            }
            fts3SegReaderSort(pCsr_00->apSegment,(int)lVar11,(int)lVar11,xCmp);
            pCsr_00->iColFilter = iVar6;
            iVar5 = 0;
          }
        }
LAB_001ce300:
      } while ((iVar5 == 0) && (lVar7 = lVar7 + 1, lVar7 < p->nToken));
      goto LAB_001ce3a1;
    }
  }
  iVar12 = iVar5;
  iVar5 = 0;
LAB_001ce3a1:
  p->bIncr = iVar12;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk
   && pCsr->bDesc==pTab->bDescIdx
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#if defined(SQLITE_DEBUG) || defined(SQLITE_TEST)
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}